

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_257,_true,_embree::sse42::VirtualCurveIntersectorK<4>,_true>::
     intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  BVH *bvh;
  long lVar3;
  size_t k;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  undefined8 unaff_RBP;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar24;
  float fVar25;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar28 [16];
  float fVar32;
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  vfloat4 a0;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  float fVar49;
  float fVar50;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar48;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  Precalculations pre;
  TravRayK<4,_true> tray;
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    iVar5 = (valid_i->field_0).i[0];
    iVar6 = (valid_i->field_0).i[1];
    iVar7 = (valid_i->field_0).i[2];
    iVar8 = (valid_i->field_0).i[3];
    auVar15._0_4_ = -(uint)(iVar5 == -1);
    auVar15._4_4_ = -(uint)(iVar6 == -1);
    auVar15._8_4_ = -(uint)(iVar7 == -1);
    auVar15._12_4_ = -(uint)(iVar8 == -1);
    iVar11 = movmskps((int)unaff_RBP,auVar15);
    uVar12 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),iVar11);
    if (iVar11 != 0) {
      auVar15 = *(undefined1 (*) [16])(ray + 0x40);
      fVar34 = auVar15._0_4_;
      fVar35 = auVar15._4_4_;
      fVar36 = auVar15._8_4_;
      fVar37 = auVar15._12_4_;
      auVar1 = *(undefined1 (*) [16])(ray + 0x50);
      fVar27 = auVar1._0_4_;
      fVar29 = auVar1._4_4_;
      fVar30 = auVar1._8_4_;
      fVar31 = auVar1._12_4_;
      auVar2 = *(undefined1 (*) [16])(ray + 0x60);
      fVar39 = auVar2._0_4_;
      fVar40 = auVar2._4_4_;
      fVar41 = auVar2._8_4_;
      fVar42 = auVar2._12_4_;
      auVar33._0_4_ = fVar27 * fVar27 + fVar39 * fVar39;
      auVar33._4_4_ = fVar29 * fVar29 + fVar40 * fVar40;
      auVar33._8_4_ = fVar30 * fVar30 + fVar41 * fVar41;
      auVar33._12_4_ = fVar31 * fVar31 + fVar42 * fVar42;
      auVar43._0_4_ = fVar34 * fVar34 + auVar33._0_4_;
      auVar43._4_4_ = fVar35 * fVar35 + auVar33._4_4_;
      auVar43._8_4_ = fVar36 * fVar36 + auVar33._8_4_;
      auVar43._12_4_ = fVar37 * fVar37 + auVar33._12_4_;
      auVar33 = rsqrtps(auVar33,auVar43);
      fVar32 = auVar33._0_4_;
      fVar13 = auVar33._4_4_;
      fVar14 = auVar33._8_4_;
      fVar24 = auVar33._12_4_;
      pre.depth_scale.field_0.v[0] = fVar32 * fVar32 * auVar43._0_4_ * -0.5 * fVar32 + fVar32 * 1.5;
      pre.depth_scale.field_0.v[1] = fVar13 * fVar13 * auVar43._4_4_ * -0.5 * fVar13 + fVar13 * 1.5;
      pre.depth_scale.field_0.v[2] = fVar14 * fVar14 * auVar43._8_4_ * -0.5 * fVar14 + fVar14 * 1.5;
      pre.depth_scale.field_0.v[3] = fVar24 * fVar24 * auVar43._12_4_ * -0.5 * fVar24 + fVar24 * 1.5
      ;
      auVar38._0_12_ = ZEXT812(0);
      auVar38._12_4_ = 0;
      uVar10 = uVar12;
      do {
        lVar3 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        auVar43 = insertps(ZEXT416(*(uint *)(ray + lVar3 * 4 + 0x40)),
                           *(undefined4 *)(ray + lVar3 * 4 + 0x50),0x1c);
        auVar43 = insertps(auVar43,*(undefined4 *)(ray + lVar3 * 4 + 0x60),0x28);
        fVar32 = *(float *)((long)pre.ray_space + lVar3 * 4 + -0x10);
        auVar44._0_4_ = auVar43._0_4_ * fVar32;
        auVar44._4_4_ = auVar43._4_4_ * fVar32;
        auVar44._8_4_ = auVar43._8_4_ * fVar32;
        auVar44._12_4_ = auVar43._12_4_ * fVar32;
        uVar9 = CONCAT44(auVar44._4_4_,auVar44._4_4_);
        auVar16._0_8_ = uVar9 ^ 0x8000000080000000;
        auVar16._8_4_ = -auVar44._12_4_;
        auVar16._12_4_ = -auVar44._12_4_;
        auVar43 = blendps(auVar16,auVar38,0xe);
        auVar53._4_4_ = auVar43._0_4_;
        auVar53._0_4_ = auVar44._8_4_;
        auVar53._8_4_ = auVar43._4_4_;
        auVar53._12_4_ = 0;
        auVar52._4_4_ = auVar43._0_4_;
        auVar52._0_4_ = auVar44._8_4_;
        auVar52._8_4_ = auVar43._4_4_;
        auVar52._12_4_ = 0;
        auVar52 = dpps(auVar52 << 0x20,auVar53 << 0x20,0x7f);
        uVar9 = CONCAT44(auVar44._12_4_,auVar44._8_4_);
        auVar46._0_8_ = uVar9 ^ 0x8000000080000000;
        auVar46._8_4_ = -auVar44._8_4_;
        auVar46._12_4_ = -auVar44._12_4_;
        auVar33 = insertps(auVar46,auVar44,0x2a);
        auVar43 = dpps(auVar33,auVar33,0x7f);
        iVar11 = -(uint)(auVar43._0_4_ < auVar52._0_4_);
        auVar17._4_4_ = iVar11;
        auVar17._0_4_ = iVar11;
        auVar17._8_4_ = iVar11;
        auVar17._12_4_ = iVar11;
        auVar43 = blendvps(auVar33,auVar53 << 0x20,auVar17);
        auVar33 = dpps(auVar43,auVar43,0x7f);
        auVar53 = rsqrtss(auVar33,auVar33);
        fVar13 = auVar53._0_4_;
        fVar13 = fVar13 * 1.5 - fVar13 * fVar13 * auVar33._0_4_ * 0.5 * fVar13;
        fVar14 = fVar13 * auVar43._0_4_;
        fVar24 = fVar13 * auVar43._4_4_;
        fVar25 = fVar13 * auVar43._8_4_;
        fVar13 = fVar13 * auVar43._12_4_;
        fVar45 = fVar24 * auVar44._0_4_ - auVar44._4_4_ * fVar14;
        fVar49 = fVar25 * auVar44._4_4_ - auVar44._8_4_ * fVar24;
        fVar50 = fVar14 * auVar44._8_4_ - auVar44._0_4_ * fVar25;
        auVar47._12_4_ = fVar13 * auVar44._12_4_ - auVar44._12_4_ * fVar13;
        auVar47._0_8_ = CONCAT44(fVar50,fVar49);
        auVar47._8_4_ = fVar45;
        auVar51._8_4_ = fVar45;
        auVar51._0_8_ = auVar47._0_8_;
        auVar51._12_4_ = auVar47._12_4_;
        auVar43 = dpps(auVar51,auVar47,0x7f);
        auVar33 = rsqrtss(auVar43,auVar43);
        fVar13 = auVar33._0_4_;
        fVar13 = fVar13 * 1.5 - fVar13 * fVar13 * auVar43._0_4_ * 0.5 * fVar13;
        aVar18.m128[1] = fVar13 * fVar45;
        aVar18.m128[0] = fVar25;
        aVar18.m128[2] = auVar44._8_4_ * fVar32;
        aVar18.m128[3] = 0.0;
        aVar48.m128[1] = fVar13 * fVar49;
        aVar48.m128[0] = fVar14;
        aVar48.m128[2] = auVar44._0_4_ * fVar32;
        aVar48.m128[3] = 0.0;
        pre.ray_space[lVar3].vx.field_0 = aVar48;
        aVar4.m128[1] = fVar13 * fVar50;
        aVar4.m128[0] = fVar24;
        aVar4.m128[2] = auVar44._4_4_ * fVar32;
        aVar4.m128[3] = 0.0;
        pre.ray_space[lVar3].vy.field_0 = aVar4;
        pre.ray_space[lVar3].vz.field_0 = aVar18;
        uVar10 = uVar10 & uVar10 - 1;
      } while (uVar10 != 0);
      auVar26._0_4_ = -(uint)(iVar5 == -1);
      auVar26._4_4_ = -(uint)(iVar6 == -1);
      auVar26._8_4_ = -(uint)(iVar7 == -1);
      auVar26._12_4_ = -(uint)(iVar8 == -1);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      auVar19._4_4_ = -(uint)(ABS(fVar35) < 1e-18);
      auVar19._0_4_ = -(uint)(ABS(fVar34) < 1e-18);
      auVar19._8_4_ = -(uint)(ABS(fVar36) < 1e-18);
      auVar19._12_4_ = -(uint)(ABS(fVar37) < 1e-18);
      auVar43 = divps(_DAT_01feca10,auVar15);
      auVar33 = divps(_DAT_01feca10,auVar1);
      auVar20._4_4_ = -(uint)(ABS(fVar29) < 1e-18);
      auVar20._0_4_ = -(uint)(ABS(fVar27) < 1e-18);
      auVar21._4_4_ = -(uint)(ABS(fVar40) < 1e-18);
      auVar21._0_4_ = -(uint)(ABS(fVar39) < 1e-18);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)blendvps(auVar43,_DAT_0201c930,auVar19);
      auVar43 = divps(_DAT_01feca10,auVar2);
      auVar20._8_4_ = -(uint)(ABS(fVar30) < 1e-18);
      auVar20._12_4_ = -(uint)(ABS(fVar31) < 1e-18);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)blendvps(auVar33,_DAT_0201c930,auVar20);
      auVar21._8_4_ = -(uint)(ABS(fVar41) < 1e-18);
      auVar21._12_4_ = -(uint)(ABS(fVar42) < 1e-18);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)blendvps(auVar43,_DAT_0201c930,auVar21);
      auVar28._0_12_ = ZEXT812(0);
      auVar28._12_4_ = 0;
      tray.nearXYZ.field_0._0_4_ = -(uint)(tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)(tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)(tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)(tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar22._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._20_4_);
      auVar22._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._16_4_);
      auVar22._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._24_4_);
      auVar22._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fed0,_DAT_01ffd210,auVar22);
      auVar23._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._36_4_);
      auVar23._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._32_4_);
      auVar23._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._40_4_);
      auVar23._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fef0,_DAT_0201fee0,auVar23);
      auVar43 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar28);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01feb9f0,auVar43,auVar26);
      auVar43 = maxps(*(undefined1 (*) [16])(ray + 0x80),auVar28);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01feba00,auVar43,auVar26);
      tray.dir.field_0._0_16_ = auVar15;
      tray.dir.field_0._16_16_ = auVar1;
      tray.dir.field_0._32_16_ = auVar2;
      do {
        k = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> k & 1) == 0; k = k + 1) {
          }
        }
        intersect1(This,bvh,(NodeRef)(bvh->root).ptr,k,&pre,ray,&tray,context);
        uVar12 = uVar12 & uVar12 - 1;
      } while (uVar12 != 0);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }